

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_f32__ieee(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_uint64 sampleCount;
  ulong uVar2;
  uchar sampleData [4096];
  double local_1038 [513];
  
  if (pWav->bytesPerSample == 4 && pWav->translatedFormatTag == 3) {
    dVar1 = drwav_read(pWav,samplesToRead,pBufferOut);
    return dVar1;
  }
  if (pWav->bytesPerSample == 0) {
    dVar1 = 0;
  }
  else {
    dVar1 = 0;
    for (; samplesToRead != 0; samplesToRead = samplesToRead - sampleCount) {
      uVar2 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < uVar2) {
        uVar2 = samplesToRead;
      }
      sampleCount = drwav_read(pWav,uVar2,local_1038);
      if (sampleCount == 0) {
        return dVar1;
      }
      if (pWav->bytesPerSample == 8) {
        drwav_f64_to_f32(pBufferOut,local_1038,sampleCount);
      }
      else if (pWav->bytesPerSample == 4) {
        for (uVar2 = 0; (uVar2 & 0xffffffff) < sampleCount; uVar2 = uVar2 + 1) {
          pBufferOut[uVar2] = *(float *)((long)local_1038 + (uVar2 & 0xffffffff) * 4);
        }
      }
      else {
        memset(pBufferOut,0,sampleCount * 4);
      }
      pBufferOut = pBufferOut + sampleCount;
      dVar1 = dVar1 + sampleCount;
    }
  }
  return dVar1;
}

Assistant:

drwav_uint64 drwav_read_f32__ieee(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    // Fast path.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT && pWav->bytesPerSample == 4) {
        return drwav_read(pWav, samplesToRead, pBufferOut);
    }

    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_f32(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}